

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

bool __thiscall
QPDF::pipeForeignStreamData
          (QPDF *this,shared_ptr<QPDF::ForeignStreamData> *foreign,Pipeline *pipeline,
          bool suppress_warnings,bool will_retry)

{
  element_type *peVar1;
  QPDFObjGen og;
  qpdf_offset_t offset;
  size_t length;
  QPDFObjectHandle stream_dict;
  bool bVar2;
  undefined7 in_register_00000009;
  undefined1 will_retry_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             (__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> *)
             (foreign->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(((foreign->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = (foreign->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  og = peVar1->foreign_og;
  offset = peVar1->offset;
  length = peVar1->length;
  will_retry_00 = 0x30;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&peVar1->local_dict);
  stream_dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ =
       ((foreign->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       is_root_metadata;
  stream_dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)&local_60;
  stream_dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._1_7_ = 0;
  bVar2 = pipeStreamData((shared_ptr<QPDF::EncryptionParameters> *)&local_50,
                         (shared_ptr<InputSource> *)&local_40,this,og,offset,length,stream_dict,
                         SUB81(pipeline,0),
                         (Pipeline *)CONCAT71(in_register_00000009,suppress_warnings),will_retry,
                         (bool)will_retry_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return bVar2;
}

Assistant:

bool
QPDF::pipeForeignStreamData(
    std::shared_ptr<ForeignStreamData> foreign,
    Pipeline* pipeline,
    bool suppress_warnings,
    bool will_retry)
{
    if (foreign->encp->encrypted) {
        QTC::TC("qpdf", "QPDF pipe foreign encrypted stream");
    }
    return pipeStreamData(
        foreign->encp,
        foreign->file,
        *this,
        foreign->foreign_og,
        foreign->offset,
        foreign->length,
        foreign->local_dict,
        foreign->is_root_metadata,
        pipeline,
        suppress_warnings,
        will_retry);
}